

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O1

void SHA512_Last(SHA512_CTX *context)

{
  uint8_t *data;
  uint64_t uVar1;
  uint64_t uVar2;
  uint uVar3;
  
  uVar2 = context->bitcount[1];
  uVar3 = (uint)context->bitcount[0] >> 3 & 0x7f;
  uVar1 = swap_bytes(context->bitcount[0]);
  context->bitcount[0] = uVar1;
  uVar1 = swap_bytes(uVar2);
  context->bitcount[1] = uVar1;
  data = context->buffer;
  if (uVar3 == 0) {
    data[0] = '\0';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    data[4] = '\0';
    data[5] = '\0';
    data[6] = '\0';
    data[7] = '\0';
    context->buffer[8] = '\0';
    context->buffer[9] = '\0';
    context->buffer[10] = '\0';
    context->buffer[0xb] = '\0';
    context->buffer[0xc] = '\0';
    context->buffer[0xd] = '\0';
    context->buffer[0xe] = '\0';
    context->buffer[0xf] = '\0';
    context->buffer[0x10] = '\0';
    context->buffer[0x11] = '\0';
    context->buffer[0x12] = '\0';
    context->buffer[0x13] = '\0';
    context->buffer[0x14] = '\0';
    context->buffer[0x15] = '\0';
    context->buffer[0x16] = '\0';
    context->buffer[0x17] = '\0';
    context->buffer[0x18] = '\0';
    context->buffer[0x19] = '\0';
    context->buffer[0x1a] = '\0';
    context->buffer[0x1b] = '\0';
    context->buffer[0x1c] = '\0';
    context->buffer[0x1d] = '\0';
    context->buffer[0x1e] = '\0';
    context->buffer[0x1f] = '\0';
    context->buffer[0x20] = '\0';
    context->buffer[0x21] = '\0';
    context->buffer[0x22] = '\0';
    context->buffer[0x23] = '\0';
    context->buffer[0x24] = '\0';
    context->buffer[0x25] = '\0';
    context->buffer[0x26] = '\0';
    context->buffer[0x27] = '\0';
    context->buffer[0x28] = '\0';
    context->buffer[0x29] = '\0';
    context->buffer[0x2a] = '\0';
    context->buffer[0x2b] = '\0';
    context->buffer[0x2c] = '\0';
    context->buffer[0x2d] = '\0';
    context->buffer[0x2e] = '\0';
    context->buffer[0x2f] = '\0';
    context->buffer[0x30] = '\0';
    context->buffer[0x31] = '\0';
    context->buffer[0x32] = '\0';
    context->buffer[0x33] = '\0';
    context->buffer[0x34] = '\0';
    context->buffer[0x35] = '\0';
    context->buffer[0x36] = '\0';
    context->buffer[0x37] = '\0';
    context->buffer[0x38] = '\0';
    context->buffer[0x39] = '\0';
    context->buffer[0x3a] = '\0';
    context->buffer[0x3b] = '\0';
    context->buffer[0x3c] = '\0';
    context->buffer[0x3d] = '\0';
    context->buffer[0x3e] = '\0';
    context->buffer[0x3f] = '\0';
    context->buffer[0x30] = '\0';
    context->buffer[0x31] = '\0';
    context->buffer[0x32] = '\0';
    context->buffer[0x33] = '\0';
    context->buffer[0x34] = '\0';
    context->buffer[0x35] = '\0';
    context->buffer[0x36] = '\0';
    context->buffer[0x37] = '\0';
    context->buffer[0x38] = '\0';
    context->buffer[0x39] = '\0';
    context->buffer[0x3a] = '\0';
    context->buffer[0x3b] = '\0';
    context->buffer[0x3c] = '\0';
    context->buffer[0x3d] = '\0';
    context->buffer[0x3e] = '\0';
    context->buffer[0x3f] = '\0';
    context->buffer[0x40] = '\0';
    context->buffer[0x41] = '\0';
    context->buffer[0x42] = '\0';
    context->buffer[0x43] = '\0';
    context->buffer[0x44] = '\0';
    context->buffer[0x45] = '\0';
    context->buffer[0x46] = '\0';
    context->buffer[0x47] = '\0';
    context->buffer[0x48] = '\0';
    context->buffer[0x49] = '\0';
    context->buffer[0x4a] = '\0';
    context->buffer[0x4b] = '\0';
    context->buffer[0x4c] = '\0';
    context->buffer[0x4d] = '\0';
    context->buffer[0x4e] = '\0';
    context->buffer[0x4f] = '\0';
    context->buffer[0x50] = '\0';
    context->buffer[0x51] = '\0';
    context->buffer[0x52] = '\0';
    context->buffer[0x53] = '\0';
    context->buffer[0x54] = '\0';
    context->buffer[0x55] = '\0';
    context->buffer[0x56] = '\0';
    context->buffer[0x57] = '\0';
    context->buffer[0x58] = '\0';
    context->buffer[0x59] = '\0';
    context->buffer[0x5a] = '\0';
    context->buffer[0x5b] = '\0';
    context->buffer[0x5c] = '\0';
    context->buffer[0x5d] = '\0';
    context->buffer[0x5e] = '\0';
    context->buffer[0x5f] = '\0';
    context->buffer[0x60] = '\0';
    context->buffer[0x61] = '\0';
    context->buffer[0x62] = '\0';
    context->buffer[99] = '\0';
    context->buffer[100] = '\0';
    context->buffer[0x65] = '\0';
    context->buffer[0x66] = '\0';
    context->buffer[0x67] = '\0';
    context->buffer[0x68] = '\0';
    context->buffer[0x69] = '\0';
    context->buffer[0x6a] = '\0';
    context->buffer[0x6b] = '\0';
    context->buffer[0x6c] = '\0';
    context->buffer[0x6d] = '\0';
    context->buffer[0x6e] = '\0';
    context->buffer[0x6f] = '\0';
    *data = 0x80;
  }
  else {
    data[uVar3] = 0x80;
    if (uVar3 < 0x70) {
      memset(data + (uVar3 + 1),0,(ulong)(0x6f - uVar3));
    }
    else {
      if (uVar3 != 0x7f) {
        memset(data + (uVar3 + 1),0,(ulong)(uVar3 ^ 0x7f));
      }
      SHA512_Transform((SHA512_CTX *)context,data);
      context->buffer[0x3e] = '\0';
      context->buffer[0x3f] = '\0';
      context->buffer[0x40] = '\0';
      context->buffer[0x41] = '\0';
      context->buffer[0x42] = '\0';
      context->buffer[0x43] = '\0';
      context->buffer[0x44] = '\0';
      context->buffer[0x45] = '\0';
      context->buffer[0x46] = '\0';
      context->buffer[0x47] = '\0';
      context->buffer[0x48] = '\0';
      context->buffer[0x49] = '\0';
      context->buffer[0x4a] = '\0';
      context->buffer[0x4b] = '\0';
      context->buffer[0x4c] = '\0';
      context->buffer[0x4d] = '\0';
      context->buffer[0x4e] = '\0';
      context->buffer[0x4f] = '\0';
      context->buffer[0x50] = '\0';
      context->buffer[0x51] = '\0';
      context->buffer[0x52] = '\0';
      context->buffer[0x53] = '\0';
      context->buffer[0x54] = '\0';
      context->buffer[0x55] = '\0';
      context->buffer[0x56] = '\0';
      context->buffer[0x57] = '\0';
      context->buffer[0x58] = '\0';
      context->buffer[0x59] = '\0';
      context->buffer[0x5a] = '\0';
      context->buffer[0x5b] = '\0';
      context->buffer[0x5c] = '\0';
      context->buffer[0x5d] = '\0';
      context->buffer[0x5e] = '\0';
      context->buffer[0x5f] = '\0';
      context->buffer[0x60] = '\0';
      context->buffer[0x61] = '\0';
      context->buffer[0x62] = '\0';
      context->buffer[99] = '\0';
      context->buffer[100] = '\0';
      context->buffer[0x65] = '\0';
      context->buffer[0x66] = '\0';
      context->buffer[0x67] = '\0';
      context->buffer[0x68] = '\0';
      context->buffer[0x69] = '\0';
      context->buffer[0x6a] = '\0';
      context->buffer[0x6b] = '\0';
      context->buffer[0x6c] = '\0';
      context->buffer[0x6d] = '\0';
      context->buffer[0x6e] = '\0';
      context->buffer[0x6f] = '\0';
      context->buffer[0x70] = '\0';
      context->buffer[0x71] = '\0';
      context->buffer[0x72] = '\0';
      context->buffer[0x73] = '\0';
      context->buffer[0x74] = '\0';
      context->buffer[0x75] = '\0';
      context->buffer[0x76] = '\0';
      context->buffer[0x77] = '\0';
      context->buffer[0x78] = '\0';
      context->buffer[0x79] = '\0';
      context->buffer[0x7a] = '\0';
      context->buffer[0x7b] = '\0';
      context->buffer[0x7c] = '\0';
      context->buffer[0x7d] = '\0';
      data[0] = '\0';
      data[1] = '\0';
      data[2] = '\0';
      data[3] = '\0';
      data[4] = '\0';
      data[5] = '\0';
      data[6] = '\0';
      data[7] = '\0';
      context->buffer[8] = '\0';
      context->buffer[9] = '\0';
      context->buffer[10] = '\0';
      context->buffer[0xb] = '\0';
      context->buffer[0xc] = '\0';
      context->buffer[0xd] = '\0';
      context->buffer[0xe] = '\0';
      context->buffer[0xf] = '\0';
      context->buffer[0x10] = '\0';
      context->buffer[0x11] = '\0';
      context->buffer[0x12] = '\0';
      context->buffer[0x13] = '\0';
      context->buffer[0x14] = '\0';
      context->buffer[0x15] = '\0';
      context->buffer[0x16] = '\0';
      context->buffer[0x17] = '\0';
      context->buffer[0x18] = '\0';
      context->buffer[0x19] = '\0';
      context->buffer[0x1a] = '\0';
      context->buffer[0x1b] = '\0';
      context->buffer[0x1c] = '\0';
      context->buffer[0x1d] = '\0';
      context->buffer[0x1e] = '\0';
      context->buffer[0x1f] = '\0';
      context->buffer[0x20] = '\0';
      context->buffer[0x21] = '\0';
      context->buffer[0x22] = '\0';
      context->buffer[0x23] = '\0';
      context->buffer[0x24] = '\0';
      context->buffer[0x25] = '\0';
      context->buffer[0x26] = '\0';
      context->buffer[0x27] = '\0';
      context->buffer[0x28] = '\0';
      context->buffer[0x29] = '\0';
      context->buffer[0x2a] = '\0';
      context->buffer[0x2b] = '\0';
      context->buffer[0x2c] = '\0';
      context->buffer[0x2d] = '\0';
      context->buffer[0x2e] = '\0';
      context->buffer[0x2f] = '\0';
      context->buffer[0x30] = '\0';
      context->buffer[0x31] = '\0';
      context->buffer[0x32] = '\0';
      context->buffer[0x33] = '\0';
      context->buffer[0x34] = '\0';
      context->buffer[0x35] = '\0';
      context->buffer[0x36] = '\0';
      context->buffer[0x37] = '\0';
      context->buffer[0x38] = '\0';
      context->buffer[0x39] = '\0';
      context->buffer[0x3a] = '\0';
      context->buffer[0x3b] = '\0';
      context->buffer[0x3c] = '\0';
      context->buffer[0x3d] = '\0';
      context->buffer[0x3e] = '\0';
      context->buffer[0x3f] = '\0';
    }
  }
  uVar1 = context->bitcount[0];
  *(uint64_t *)(context->buffer + 0x70) = context->bitcount[1];
  *(uint64_t *)(context->buffer + 0x78) = uVar1;
  SHA512_Transform((SHA512_CTX *)context,data);
  return;
}

Assistant:

void SHA512_Last(SHA512_CTX* context) {
	unsigned int	usedspace;

	usedspace = (context->bitcount[0] >> 3) % SHA512_BLOCK_LENGTH;
#if BYTE_ORDER == LITTLE_ENDIAN
	/* Convert FROM host byte order */
	REVERSE64(context->bitcount[0],context->bitcount[0]);
	REVERSE64(context->bitcount[1],context->bitcount[1]);
#endif
	if (usedspace > 0) {
		/* Begin padding with a 1 bit: */
		context->buffer[usedspace++] = 0x80;

		if (usedspace <= SHA512_SHORT_BLOCK_LENGTH) {
			/* Set-up for the last transform: */
			MEMSET_BZERO(&context->buffer[usedspace], SHA512_SHORT_BLOCK_LENGTH - usedspace);
		} else {
			if (usedspace < SHA512_BLOCK_LENGTH) {
				MEMSET_BZERO(&context->buffer[usedspace], SHA512_BLOCK_LENGTH - usedspace);
			}
			/* Do second-to-last transform: */
			SHA512_Transform(context, (sha2_word64*)context->buffer);

			/* And set-up for the last transform: */
			MEMSET_BZERO(context->buffer, SHA512_BLOCK_LENGTH - 2);
		}
	} else {
		/* Prepare for final transform: */
		MEMSET_BZERO(context->buffer, SHA512_SHORT_BLOCK_LENGTH);

		/* Begin padding with a 1 bit: */
		*context->buffer = 0x80;
	}
	/* Store the length of input data (in bits): */
    sha2_word64 *ptr = (sha2_word64*)(&context->buffer[SHA512_SHORT_BLOCK_LENGTH]);
    *ptr = context->bitcount[1];
    ptr = (sha2_word64*)(&context->buffer[SHA512_SHORT_BLOCK_LENGTH+8]);
    *ptr = context->bitcount[0];

	/* Final transform: */
	SHA512_Transform(context, (sha2_word64*)context->buffer);
}